

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall GlobOpt::CaptureByteCodeSymUses(GlobOpt *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  TrackAllocData local_40;
  Instr *local_18;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if (this->byteCodeUses == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    local_18 = instr;
    instr_local = (Instr *)this;
    this_00 = Func::GetJITFunctionBody(this->func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (!bVar2) {
      if (this->propertySymUse != (PropertySym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x1d2,"(this->propertySymUse == __null)","this->propertySymUse == NULL")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pJVar4 = this->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_40,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                 ,0x1d3);
      pJVar4 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar4,&local_40);
      this_01 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_01,this->alloc);
      this->byteCodeUses = this_01;
      TrackByteCodeSymUsed(local_18,this->byteCodeUses,&this->propertySymUse);
      bVar2 = BVSparse<Memory::JitArenaAllocator>::Equal
                        (this->byteCodeUses,this->byteCodeUsesBeforeOpt);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x1d7,"(this->byteCodeUses->Equal(this->byteCodeUsesBeforeOpt))",
                           "Instruction edited before capturing the byte code use");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::CaptureByteCodeSymUses(IR::Instr * instr)
{
    if (this->byteCodeUses || this->func->GetJITFunctionBody()->IsAsmJsMode())
    {
        // We already captured it before.
        return;
    }
    Assert(this->propertySymUse == NULL);
    this->byteCodeUses = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    GlobOpt::TrackByteCodeSymUsed(instr, this->byteCodeUses, &this->propertySymUse);

    AssertMsg(this->byteCodeUses->Equal(this->byteCodeUsesBeforeOpt),
        "Instruction edited before capturing the byte code use");
}